

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>_>
::params_t<int>::append<bool>(params_t<int> *this,iuParamGenerator<bool> *gen)

{
  iterator __position;
  int iVar1;
  uint local_1c;
  
  (*gen->m_pInterface->_vptr_iuIParamGenerator[2])();
  iVar1 = (*gen->m_pInterface->_vptr_iuIParamGenerator[5])();
  if ((char)iVar1 == '\0') {
    do {
      local_1c = (*gen->m_pInterface->_vptr_iuIParamGenerator[3])();
      local_1c = local_1c & 0xff;
      __position._M_current =
           (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      if (__position._M_current ==
          (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->val,__position,(int *)&local_1c);
      }
      else {
        *__position._M_current = local_1c;
        (this->val).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      (*gen->m_pInterface->_vptr_iuIParamGenerator[4])();
      iVar1 = (*gen->m_pInterface->_vptr_iuIParamGenerator[5])();
    } while ((char)iVar1 == '\0');
  }
  return;
}

Assistant:

void append(iuParamGenerator<U>& gen)
        {
            for( gen.Begin(); !gen.IsEnd(); gen.Next() )
            {
                val.push_back(static_cast<T>(gen.GetCurrent()));
            }
        }